

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O1

bool __thiscall
xercesc_4_0::TraverseSchema::checkElemDeclValueConstraint
          (TraverseSchema *this,DOMElement *elem,SchemaElementDecl *elemDecl,XMLCh *valConstraint,
          ComplexTypeInfo *typeInfo,DatatypeValidator *validator)

{
  short *psVar1;
  short sVar2;
  char16_t cVar3;
  char16_t cVar4;
  XMLStringPool *pXVar5;
  MemoryManager *pMVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char16_t *toDelete;
  char16_t *pcVar11;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  char16_t *pcVar12;
  size_t sVar13;
  ArrayJanitor<char16_t> tempCanonical;
  ArrayJanitor<char16_t> local_40;
  XMLCh *pXVar10;
  undefined4 extraout_var_01;
  
  if (validator == (DatatypeValidator *)0x0) {
    bVar7 = false;
    goto LAB_00339393;
  }
  if (validator->fType == ID) {
    reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x5c,
                      ((elemDecl->super_XMLElementDecl).fElementName)->fLocalPart,valConstraint,
                      (XMLCh *)0x0,(XMLCh *)0x0);
  }
  sVar2 = validator->fWhiteSpace;
  if (((sVar2 == 1) && (bVar7 = XMLString::isWSReplaced(valConstraint), !bVar7)) ||
     ((sVar2 == 2 && (bVar7 = XMLString::isWSCollapsed(valConstraint), !bVar7)))) {
    if (valConstraint == (XMLCh *)0x0) {
      pXVar10 = (XMLCh *)0x0;
    }
    else {
      sVar13 = 0;
      do {
        psVar1 = (short *)((long)valConstraint + sVar13);
        sVar13 = sVar13 + 2;
      } while (*psVar1 != 0);
      iVar8 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar13);
      pXVar10 = (XMLCh *)CONCAT44(extraout_var,iVar8);
      memcpy(pXVar10,valConstraint,sVar13);
    }
    ArrayJanitor<char16_t>::ArrayJanitor(&local_40,pXVar10,this->fMemoryManager);
    if (sVar2 == 1) {
      XMLString::replaceWS(pXVar10,this->fMemoryManager);
    }
    else if (sVar2 == 2) {
      XMLString::collapseWS(pXVar10,this->fMemoryManager);
    }
    pXVar5 = this->fStringPool;
    uVar9 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[5])(pXVar5,pXVar10);
    iVar8 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[10])(pXVar5,(ulong)uVar9);
    valConstraint = (XMLCh *)CONCAT44(extraout_var_00,iVar8);
    ArrayJanitor<char16_t>::~ArrayJanitor(&local_40);
  }
  (*(validator->super_XSerializable)._vptr_XSerializable[8])
            (validator,valConstraint,0,this->fMemoryManager);
  iVar8 = (*(validator->super_XSerializable)._vptr_XSerializable[7])
                    (validator,valConstraint,this->fMemoryManager,0);
  toDelete = (char16_t *)CONCAT44(extraout_var_01,iVar8);
  ArrayJanitor<char16_t>::ArrayJanitor(&local_40,toDelete,this->fMemoryManager);
  if (toDelete != valConstraint) {
    pcVar11 = valConstraint;
    pcVar12 = toDelete;
    if (valConstraint == (char16_t *)0x0 || toDelete == (char16_t *)0x0) {
      if (toDelete == (char16_t *)0x0) {
        if (valConstraint == (char16_t *)0x0) goto LAB_0033931a;
LAB_003392d9:
        bVar7 = *pcVar11 == L'\0';
      }
      else {
        bVar7 = *toDelete == L'\0';
        if ((valConstraint != (char16_t *)0x0) && (*toDelete == L'\0')) goto LAB_003392d9;
      }
      if (bVar7) goto LAB_0033931a;
    }
    else {
      do {
        cVar3 = *pcVar12;
        if (cVar3 == L'\0') goto LAB_003392d9;
        cVar4 = *pcVar11;
        pcVar11 = pcVar11 + 1;
        pcVar12 = pcVar12 + 1;
      } while (cVar3 == cVar4);
    }
    (*(validator->super_XSerializable)._vptr_XSerializable[8])
              (validator,toDelete,0,this->fMemoryManager);
    pXVar5 = this->fStringPool;
    uVar9 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[5])(pXVar5,toDelete);
    iVar8 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[10])(pXVar5,(ulong)uVar9);
    valConstraint = (XMLCh *)CONCAT44(extraout_var_02,iVar8);
  }
LAB_0033931a:
  if (elemDecl->fDefaultValue != (XMLCh *)0x0) {
    (*((elemDecl->super_XMLElementDecl).fMemoryManager)->_vptr_MemoryManager[4])();
  }
  if (valConstraint == (char16_t *)0x0) {
    pXVar10 = (XMLCh *)0x0;
  }
  else {
    pMVar6 = (elemDecl->super_XMLElementDecl).fMemoryManager;
    sVar13 = 0;
    do {
      psVar1 = (short *)((long)valConstraint + sVar13);
      sVar13 = sVar13 + 2;
    } while (*psVar1 != 0);
    iVar8 = (*pMVar6->_vptr_MemoryManager[3])(pMVar6,sVar13);
    pXVar10 = (XMLCh *)CONCAT44(extraout_var_03,iVar8);
    memcpy(pXVar10,valConstraint,sVar13);
  }
  elemDecl->fDefaultValue = pXVar10;
  ArrayJanitor<char16_t>::~ArrayJanitor(&local_40);
  bVar7 = true;
LAB_00339393:
  if (typeInfo != (ComplexTypeInfo *)0x0) {
    uVar9 = typeInfo->fContentType;
    if ((5 < uVar9) || ((0x2cU >> (uVar9 & 0x1f) & 1) == 0)) {
      reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x37,
                        ((elemDecl->super_XMLElementDecl).fElementName)->fLocalPart,(XMLCh *)0x0,
                        (XMLCh *)0x0,(XMLCh *)0x0);
    }
    if (((((uVar9 & 0xfffffffe) == 2) && (typeInfo->fContentSpec != (ContentSpecNode *)0x0)) &&
        (this->fFullConstraintChecking != false)) &&
       (iVar8 = ContentSpecNode::getMinTotalRange(typeInfo->fContentSpec), iVar8 != 0)) {
      reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x5e,
                        ((elemDecl->super_XMLElementDecl).fElementName)->fLocalPart,(XMLCh *)0x0,
                        (XMLCh *)0x0,(XMLCh *)0x0);
    }
  }
  return bVar7;
}

Assistant:

bool
TraverseSchema::checkElemDeclValueConstraint(const DOMElement* const elem,
                                             SchemaElementDecl* const elemDecl,
                                             const XMLCh* const valConstraint,
                                             ComplexTypeInfo* const typeInfo,
                                             DatatypeValidator* const validator)
{
    bool isValid = false;
    if (validator)
    {
        if (validator->getType() == DatatypeValidator::ID)
            reportSchemaError(
                elem, XMLUni::fgXMLErrDomain, XMLErrs::ElemIDValueConstraint
                , elemDecl->getBaseName(), valConstraint
            );

        try
        {
            const XMLCh* valueToCheck = valConstraint;
            short wsFacet = validator->getWSFacet();
            if((wsFacet == DatatypeValidator::REPLACE && !XMLString::isWSReplaced(valueToCheck)) ||
               (wsFacet == DatatypeValidator::COLLAPSE && !XMLString::isWSCollapsed(valueToCheck)))
            {
                XMLCh* normalizedValue=XMLString::replicate(valueToCheck, fMemoryManager);
                ArrayJanitor<XMLCh> tempURIName(normalizedValue, fMemoryManager);
                if(wsFacet == DatatypeValidator::REPLACE)
                    XMLString::replaceWS(normalizedValue, fMemoryManager);
                else if(wsFacet == DatatypeValidator::COLLAPSE)
                    XMLString::collapseWS(normalizedValue, fMemoryManager);
                valueToCheck=fStringPool->getValueForId(fStringPool->addOrFind(normalizedValue));
            }

            validator->validate(valueToCheck,0,fMemoryManager);

            XMLCh* canonical = (XMLCh*) validator->getCanonicalRepresentation(valueToCheck, fMemoryManager);
            ArrayJanitor<XMLCh> tempCanonical(canonical, fMemoryManager);

            if(!XMLString::equals(canonical, valueToCheck))
            {
                validator->validate(canonical, 0, fMemoryManager);
                valueToCheck=fStringPool->getValueForId(fStringPool->addOrFind(canonical));
            }

            elemDecl->setDefaultValue(valueToCheck);

            isValid = true;
        }
        catch(const XMLException& excep)
        {
            reportSchemaError(elem, excep);
        }
        catch(const OutOfMemoryException&)
        {
            throw;
        }
        catch(...)
        {
            reportSchemaError(elem, XMLUni::fgValidityDomain, XMLValid::DatatypeValidationFailure, valConstraint);
        }
    }

    if (typeInfo)
    {
        int contentSpecType = typeInfo->getContentType();

        if (contentSpecType != SchemaElementDecl::Simple &&
            contentSpecType != SchemaElementDecl::Mixed_Simple &&
            contentSpecType != SchemaElementDecl::Mixed_Complex)
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::NotSimpleOrMixedElement, elemDecl->getBaseName());

        if (((contentSpecType == SchemaElementDecl::Mixed_Complex
             || contentSpecType == SchemaElementDecl::Mixed_Simple)
            && !emptiableParticle(typeInfo->getContentSpec())))
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::EmptiableMixedContent, elemDecl->getBaseName());
    }

    return isValid;
}